

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::x86::EmitHelper::emitRegMove
          (EmitHelper *this,Operand_ *dst_,Operand_ *src_,TypeId typeId,char *comment)

{
  bool bVar1;
  TypeId in_CL;
  ulong uVar2;
  Operand_ *in_RDX;
  Operand_ *in_RSI;
  long in_RDI;
  char *in_R8;
  TypeId scalarTypeId;
  uint32_t overrideMemSize;
  uint32_t memFlags;
  InstId instId;
  Operand src;
  Operand dst;
  char *in_stack_00000360;
  int in_stack_0000036c;
  char *in_stack_00000370;
  undefined8 in_stack_ffffffffffffff68;
  uint32_t uVar3;
  Mem *in_stack_ffffffffffffff70;
  Mem *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  byte bVar4;
  undefined7 in_stack_ffffffffffffff90;
  TypeId in_stack_ffffffffffffff97;
  Signature local_68;
  Signature local_64;
  Signature local_60;
  int local_5c;
  uint local_58;
  int local_54;
  Operand_ local_50;
  Operand_ local_40;
  char *local_30;
  TypeId local_21;
  Operand_ *local_20;
  Operand_ *local_18;
  Error local_4;
  
  uVar3 = (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_30 = in_R8;
  local_21 = in_CL;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = TypeUtils::isValid(kVoid);
  bVar4 = 0;
  if (bVar1) {
    bVar1 = TypeUtils::isAbstract(kVoid);
    bVar4 = bVar1 ^ 0xff;
  }
  if ((bVar4 & 1) == 0) {
    DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
  }
  Operand::Operand((Operand *)&local_40,local_18);
  Operand::Operand((Operand *)&local_50,local_20);
  local_54 = 0;
  local_58 = 0;
  local_5c = 0;
  bVar1 = Operand_::isMem((Operand_ *)0x188af8);
  if (bVar1) {
    local_58 = local_58 | 1;
    in_stack_ffffffffffffff78 = Operand_::as<asmjit::_abi_1_10::x86::Mem>(&local_40);
    Operand_::size((Operand_ *)0x188b22);
    BaseMem::setSize(&in_stack_ffffffffffffff70->super_BaseMem,uVar3);
  }
  bVar1 = Operand_::isMem((Operand_ *)0x188b38);
  if (bVar1) {
    local_58 = local_58 | 2;
    in_stack_ffffffffffffff70 = Operand_::as<asmjit::_abi_1_10::x86::Mem>(&local_50);
    Operand_::size((Operand_ *)0x188b62);
    BaseMem::setSize(&in_stack_ffffffffffffff70->super_BaseMem,uVar3);
  }
  uVar2 = (ulong)(byte)(local_21 - kInt8);
  switch(uVar2) {
  case 0:
  case 1:
  case 2:
  case 3:
    if ((local_58 & 2) != 0) {
      local_54 = 0x1c9;
      local_60._bits = (uint32_t)Reg::signatureOfT<(asmjit::_abi_1_10::RegType)6>();
      Operand_::setSignature(&local_40,&local_60);
      break;
    }
    if (local_58 == 0) {
      local_64._bits = (uint32_t)Reg::signatureOfT<(asmjit::_abi_1_10::RegType)6>();
      Operand_::setSignature(&local_40,&local_64);
      local_68._bits = (uint32_t)Reg::signatureOfT<(asmjit::_abi_1_10::RegType)6>();
      Operand_::setSignature(&local_50,&local_68);
    }
  case 4:
  case 5:
  case 6:
  case 7:
    local_54 = 0x1a2;
    break;
  default:
    in_stack_ffffffffffffff97 = TypeUtils::scalarOf(local_21);
    bVar1 = TypeUtils::isVec32(kVoid);
    if ((bVar1) && (local_58 != 0)) {
      local_5c = 4;
      if (in_stack_ffffffffffffff97 == _kFloatStart) {
        local_54 = 0x1c4;
        if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
          local_54 = 0x49e;
        }
      }
      else {
        local_54 = 0x1a7;
        if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
          local_54 = 0x483;
        }
      }
    }
    else {
      bVar1 = TypeUtils::isVec64(kVoid);
      if ((bVar1) && (local_58 != 0)) {
        local_5c = 8;
        if (in_stack_ffffffffffffff97 == kFloat64) {
          local_54 = 0x1c1;
          if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
            local_54 = 0x49a;
          }
        }
        else {
          local_54 = 0x1be;
          if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
            local_54 = 0x499;
          }
        }
      }
      else if (in_stack_ffffffffffffff97 == _kFloatStart) {
        local_54 = 0x1a5;
        if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
          local_54 = 0x482;
        }
      }
      else if (in_stack_ffffffffffffff97 == kFloat64) {
        local_54 = 0x1a4;
        if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
          local_54 = 0x481;
        }
      }
      else if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
        local_54 = 0x1ac;
        if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
          local_54 = 0x485;
        }
      }
      else {
        local_54 = 0x486;
      }
    }
    break;
  case 0xb:
    local_54 = 0x150;
    break;
  case 0xc:
    local_54 = 0x153;
    break;
  case 0xd:
    local_54 = 0x151;
    break;
  case 0xe:
    local_54 = 0x152;
    break;
  case 0xf:
    local_54 = 0x1a7;
    if (local_58 != 0) break;
  case 0x10:
    local_54 = 0x1be;
  }
  uVar3 = (uint32_t)(uVar2 >> 0x20);
  if (local_54 == 0) {
    local_4 = DebugUtils::errored(3);
  }
  else {
    if (local_5c != 0) {
      bVar1 = Operand_::isMem((Operand_ *)0x188dec);
      if (bVar1) {
        Operand_::as<asmjit::_abi_1_10::x86::Mem>(&local_40);
        BaseMem::setSize(&in_stack_ffffffffffffff70->super_BaseMem,uVar3);
      }
      bVar1 = Operand_::isMem((Operand_ *)0x188e12);
      if (bVar1) {
        Operand_::as<asmjit::_abi_1_10::x86::Mem>(&local_50);
        BaseMem::setSize(&in_stack_ffffffffffffff70->super_BaseMem,uVar3);
      }
    }
    BaseEmitter::setInlineComment(*(BaseEmitter **)(in_RDI + 8),local_30);
    local_4 = BaseEmitter::emit<asmjit::_abi_1_10::Operand&,asmjit::_abi_1_10::Operand&>
                        ((BaseEmitter *)
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         (InstId)((ulong)in_RDI >> 0x20),
                         (Operand *)CONCAT17(bVar4,in_stack_ffffffffffffff80),
                         (Operand *)in_stack_ffffffffffffff78);
  }
  return local_4;
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitRegMove(
  const Operand_& dst_,
  const Operand_& src_, TypeId typeId, const char* comment) {

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeUtils::isValid(typeId) && !TypeUtils::isAbstract(typeId));

  Operand dst(dst_);
  Operand src(src_);

  InstId instId = Inst::kIdNone;
  uint32_t memFlags = 0;
  uint32_t overrideMemSize = 0;

  enum MemFlags : uint32_t {
    kDstMem = 0x1,
    kSrcMem = 0x2
  };

  // Detect memory operands and patch them to have the same size as the register. BaseCompiler always sets memory size
  // of allocs and spills, so it shouldn't be really necessary, however, after this function was separated from Compiler
  // it's better to make sure that the size is always specified, as we can use 'movzx' and 'movsx' that rely on it.
  if (dst.isMem()) { memFlags |= kDstMem; dst.as<Mem>().setSize(src.size()); }
  if (src.isMem()) { memFlags |= kSrcMem; src.as<Mem>().setSize(dst.size()); }

  switch (typeId) {
    case TypeId::kInt8:
    case TypeId::kUInt8:
    case TypeId::kInt16:
    case TypeId::kUInt16:
      // Special case - 'movzx' load.
      if (memFlags & kSrcMem) {
        instId = Inst::kIdMovzx;
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        break;
      }

      if (!memFlags) {
        // Change both destination and source registers to GPD (safer, no dependencies).
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        src.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kInt32:
    case TypeId::kUInt32:
    case TypeId::kInt64:
    case TypeId::kUInt64:
      instId = Inst::kIdMov;
      break;

    case TypeId::kMmx32:
      instId = Inst::kIdMovd;
      if (memFlags) break;
      ASMJIT_FALLTHROUGH;

    case TypeId::kMmx64 : instId = Inst::kIdMovq ; break;
    case TypeId::kMask8 : instId = Inst::kIdKmovb; break;
    case TypeId::kMask16: instId = Inst::kIdKmovw; break;
    case TypeId::kMask32: instId = Inst::kIdKmovd; break;
    case TypeId::kMask64: instId = Inst::kIdKmovq; break;

    default: {
      TypeId scalarTypeId = TypeUtils::scalarOf(typeId);
      if (TypeUtils::isVec32(typeId) && memFlags) {
        overrideMemSize = 4;
        if (scalarTypeId == TypeId::kFloat32)
          instId = _avxEnabled ? Inst::kIdVmovss : Inst::kIdMovss;
        else
          instId = _avxEnabled ? Inst::kIdVmovd : Inst::kIdMovd;
        break;
      }

      if (TypeUtils::isVec64(typeId) && memFlags) {
        overrideMemSize = 8;
        if (scalarTypeId == TypeId::kFloat64)
          instId = _avxEnabled ? Inst::kIdVmovsd : Inst::kIdMovsd;
        else
          instId = _avxEnabled ? Inst::kIdVmovq : Inst::kIdMovq;
        break;
      }

      if (scalarTypeId == TypeId::kFloat32)
        instId = _avxEnabled ? Inst::kIdVmovaps : Inst::kIdMovaps;
      else if (scalarTypeId == TypeId::kFloat64)
        instId = _avxEnabled ? Inst::kIdVmovapd : Inst::kIdMovapd;
      else if (!_avx512Enabled)
        instId = _avxEnabled ? Inst::kIdVmovdqa : Inst::kIdMovdqa;
      else
        instId = Inst::kIdVmovdqa32;
      break;
    }
  }

  if (!instId)
    return DebugUtils::errored(kErrorInvalidState);

  if (overrideMemSize) {
    if (dst.isMem()) dst.as<Mem>().setSize(overrideMemSize);
    if (src.isMem()) src.as<Mem>().setSize(overrideMemSize);
  }

  _emitter->setInlineComment(comment);
  return _emitter->emit(instId, dst, src);
}